

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

peer_class_info * __thiscall
libtorrent::session_handle::
sync_call_ret<libtorrent::peer_class_info,libtorrent::peer_class_info(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>)const,libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&>
          (peer_class_info *__return_storage_ptr__,session_handle *this,
          offset_in_session_impl_to_subr f,
          strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void> *a)

{
  io_context *ctx;
  undefined8 uVar1;
  uint *in_R8;
  bool done;
  exception_ptr ex;
  shared_ptr<libtorrent::aux::session_impl> s;
  bool local_91;
  exception_ptr local_90;
  __shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> local_88;
  exception_ptr local_78;
  undefined1 local_70 [56];
  bitfield_flag<unsigned_int,_libtorrent::save_state_flags_tag,_void> local_38;
  
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_88);
  if (local_88._M_ptr == (session_impl *)0x0) {
    local_70._0_4_ = 0x73;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
              ((error_code_enum *)local_70);
  }
  (__return_storage_ptr__->label)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->label).field_2;
  (__return_storage_ptr__->label)._M_string_length = 0;
  local_70._8_8_ = &local_91;
  local_91 = false;
  (__return_storage_ptr__->label).field_2._M_local_buf[0] = '\0';
  local_70._16_8_ = &local_90;
  local_90._M_exception_object = (void *)0x0;
  ctx = (local_88._M_ptr)->m_io_context;
  local_70._0_8_ = __return_storage_ptr__;
  ::std::__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<libtorrent::aux::session_impl,_(__gnu_cxx::_Lock_policy)2> *)
             (local_70 + 0x18),&local_88);
  local_38.m_val = *in_R8;
  local_70._40_8_ = f;
  local_70._48_8_ = a;
  boost::asio::
  dispatch<boost::asio::io_context,libtorrent::session_handle::sync_call_ret<libtorrent::peer_class_info,libtorrent::peer_class_info(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>)const,libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&>(libtorrent::peer_class_info(libtorrent::aux::session_impl::*)(libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>)const,libtorrent::aux::strong_typedef<unsigned_int,libtorrent::peer_class_tag,void>&)const::_lambda()_1_>
            (ctx,(type *)local_70,(type *)0x0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_70 + 0x20));
  aux::torrent_wait(&local_91,local_88._M_ptr);
  if (local_90._M_exception_object == (void *)0x0) {
    ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
    return __return_storage_ptr__;
  }
  ::std::__exception_ptr::exception_ptr::exception_ptr(&local_78,&local_90);
  uVar1 = ::std::rethrow_exception((exception_ptr)&local_78);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_78);
  ::std::__exception_ptr::exception_ptr::~exception_ptr(&local_90);
  ::std::__cxx11::string::~string((string *)&__return_storage_ptr__->label);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88._M_refcount);
  _Unwind_Resume(uVar1);
}

Assistant:

Ret session_handle::sync_call_ret(Fun f, Args&&... a) const
	{
		std::shared_ptr<session_impl> s = m_impl.lock();
		if (!s) aux::throw_ex<system_error>(errors::invalid_session_handle);

		// this is the flag to indicate the call has completed
		// capture them by pointer to allow everything to be captured by value
		// and simplify the capture expression
		bool done = false;
		Ret r;
		std::exception_ptr ex;
		dispatch(s->get_context(), [=, &r, &done, &ex]() mutable
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				r = (s.get()->*f)(std::forward<Args>(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (...) {
				ex = std::current_exception();
			}
#endif
			std::unique_lock<std::mutex> l(s->mut);
			done = true;
			s->cond.notify_all();
		});

		aux::torrent_wait(done, *s);
		if (ex) std::rethrow_exception(ex);
		return r;
	}